

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall deqp::gls::ContextShaderProgram::shadeFragments(ContextShaderProgram *this)

{
  int iVar1;
  GenericVec4 *pGVar2;
  FragmentShadingContext *in_RCX;
  uint in_EDX;
  FragmentPacket *in_RSI;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  deUint32 dStack_28;
  deUint32 dStack_24;
  deUint32 dStack_20;
  deUint32 dStack_1c;
  
  iVar6 = 0;
  rr::readTriangleVarying<float>((rr *)&dStack_28,in_RSI,in_RCX,0,0);
  if (0 < (int)in_EDX) {
    pGVar2 = in_RCX->outputArray;
    iVar1 = in_RCX->numFragmentOutputs;
    uVar3 = 0;
    do {
      lVar4 = 4;
      iVar5 = iVar6;
      do {
        pGVar2[iVar5].v.uData[0] = dStack_28;
        pGVar2[iVar5].v.uData[1] = dStack_24;
        pGVar2[iVar5].v.uData[2] = dStack_20;
        pGVar2[iVar5].v.uData[3] = dStack_1c;
        iVar5 = iVar5 + iVar1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      uVar3 = uVar3 + 1;
      iVar6 = iVar6 + iVar1 * 4;
    } while (uVar3 != in_EDX);
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const size_t varyingLocColor = 0;

	// Triangles are flashaded
	tcu::Vec4 color = rr::readTriangleVarying<float>(packets[0], context, varyingLocColor, 0);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}